

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O3

int mbedtls_arc4_self_test(int verbose)

{
  int iVar1;
  long lVar2;
  uchar ibuf [8];
  uchar obuf [8];
  mbedtls_arc4_context ctx;
  uchar local_148 [8];
  uchar local_140 [8];
  mbedtls_arc4_context local_138;
  
  memset(&local_138,0,0x108);
  lVar2 = 0;
  do {
    while( true ) {
      if (verbose != 0) {
        printf("  ARC4 test #%d: ",(ulong)((int)lVar2 + 1));
      }
      local_148 = arc4_test_pt[lVar2];
      mbedtls_arc4_setup(&local_138,arc4_test_key[lVar2],8);
      mbedtls_arc4_crypt(&local_138,8,local_148,local_140);
      if (local_140 != arc4_test_ct[lVar2]) {
        iVar1 = 1;
        if (verbose != 0) {
          puts("failed");
        }
        goto LAB_0016bbea;
      }
      if (verbose != 0) break;
      lVar2 = lVar2 + 1;
      if (lVar2 == 3) {
LAB_0016bbe8:
        iVar1 = 0;
LAB_0016bbea:
        lVar2 = 0;
        do {
          local_138.m[lVar2 + -8] = '\0';
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x108);
        return iVar1;
      }
    }
    puts("passed");
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  putchar(10);
  goto LAB_0016bbe8;
}

Assistant:

int mbedtls_arc4_self_test( int verbose )
{
    int i, ret = 0;
    unsigned char ibuf[8];
    unsigned char obuf[8];
    mbedtls_arc4_context ctx;

    mbedtls_arc4_init( &ctx );

    for( i = 0; i < 3; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  ARC4 test #%d: ", i + 1 );

        memcpy( ibuf, arc4_test_pt[i], 8 );

        mbedtls_arc4_setup( &ctx, arc4_test_key[i], 8 );
        mbedtls_arc4_crypt( &ctx, 8, ibuf, obuf );

        if( memcmp( obuf, arc4_test_ct[i], 8 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_arc4_free( &ctx );

    return( ret );
}